

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

ContinueBlockType __thiscall
diligent_spirv_cross::Compiler::continue_block_type(Compiler *this,SPIRBlock *block)

{
  uint32_t uVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  SPIRBlock *to;
  SPIRBlock *from;
  SPIRBlock *from_00;
  SPIRBlock *to_00;
  uint32_t uVar5;
  ContinueBlockType CVar6;
  ContinueBlockType CVar7;
  
  CVar6 = ComplexLoop;
  CVar7 = CVar6;
  if (((block->complex_continue == false) && (CVar7 = WhileLoop, block->merge != MergeLoop)) &&
     (uVar1 = (block->loop_dominator).id, CVar7 = CVar6, uVar1 != 0xffffffff)) {
    to = get<diligent_spirv_cross::SPIRBlock>(this,uVar1);
    bVar2 = execution_is_noop(this,block,to);
    CVar7 = WhileLoop;
    if (!bVar2) {
      bVar2 = execution_is_branchless(this,block,to);
      if (bVar2) {
        CVar7 = ForLoop;
      }
      else {
        from = maybe_get<diligent_spirv_cross::SPIRBlock>(this,(block->false_block).id);
        from_00 = maybe_get<diligent_spirv_cross::SPIRBlock>(this,(block->true_block).id);
        to_00 = maybe_get<diligent_spirv_cross::SPIRBlock>(this,(to->merge_block).id);
        if (from == (SPIRBlock *)0x0) {
          bVar2 = false;
        }
        else {
          bVar2 = flush_phi_required(this,(BlockID)(block->super_IVariant).self.id,
                                     (BlockID)(block->false_block).id);
        }
        if (from_00 == (SPIRBlock *)0x0) {
          bVar3 = false;
        }
        else {
          bVar3 = flush_phi_required(this,(BlockID)(block->super_IVariant).self.id,
                                     (BlockID)(block->true_block).id);
        }
        CVar7 = CVar6;
        if (bVar2 == false && bVar3 == false) {
          uVar1 = (block->true_block).id;
          uVar4 = (block->false_block).id;
          uVar5 = (to->super_IVariant).self.id;
          if (uVar1 == uVar5) {
            uVar5 = uVar1;
            bVar2 = true;
            if (uVar4 != (to->merge_block).id) {
              bVar2 = false;
              if ((from != (SPIRBlock *)0x0) && (bVar2 = false, to_00 != (SPIRBlock *)0x0)) {
                bVar2 = execution_is_noop(this,from,to_00);
                uVar4 = (block->false_block).id;
                uVar5 = (to->super_IVariant).self.id;
              }
            }
          }
          else {
            bVar2 = false;
          }
          if (uVar4 == uVar5) {
            bVar3 = true;
            if ((block->true_block).id != (to->merge_block).id) {
              bVar3 = false;
              if ((from_00 != (SPIRBlock *)0x0) && (bVar3 = false, to_00 != (SPIRBlock *)0x0)) {
                bVar3 = execution_is_noop(this,from_00,to_00);
              }
            }
          }
          else {
            bVar3 = false;
          }
          CVar7 = ComplexLoop -
                  (byte)((bVar2 | bVar3) &
                        (*(int *)&(block->super_IVariant).field_0xc == 2 &&
                        block->merge == MergeNone));
        }
      }
    }
  }
  return CVar7;
}

Assistant:

SPIRBlock::ContinueBlockType Compiler::continue_block_type(const SPIRBlock &block) const
{
	// The block was deemed too complex during code emit, pick conservative fallback paths.
	if (block.complex_continue)
		return SPIRBlock::ComplexLoop;

	// In older glslang output continue block can be equal to the loop header.
	// In this case, execution is clearly branchless, so just assume a while loop header here.
	if (block.merge == SPIRBlock::MergeLoop)
		return SPIRBlock::WhileLoop;

	if (block.loop_dominator == BlockID(SPIRBlock::NoDominator))
	{
		// Continue block is never reached from CFG.
		return SPIRBlock::ComplexLoop;
	}

	auto &dominator = get<SPIRBlock>(block.loop_dominator);

	if (execution_is_noop(block, dominator))
		return SPIRBlock::WhileLoop;
	else if (execution_is_branchless(block, dominator))
		return SPIRBlock::ForLoop;
	else
	{
		const auto *false_block = maybe_get<SPIRBlock>(block.false_block);
		const auto *true_block = maybe_get<SPIRBlock>(block.true_block);
		const auto *merge_block = maybe_get<SPIRBlock>(dominator.merge_block);

		// If we need to flush Phi in this block, we cannot have a DoWhile loop.
		bool flush_phi_to_false = false_block && flush_phi_required(block.self, block.false_block);
		bool flush_phi_to_true = true_block && flush_phi_required(block.self, block.true_block);
		if (flush_phi_to_false || flush_phi_to_true)
			return SPIRBlock::ComplexLoop;

		bool positive_do_while = block.true_block == dominator.self &&
		                         (block.false_block == dominator.merge_block ||
		                          (false_block && merge_block && execution_is_noop(*false_block, *merge_block)));

		bool negative_do_while = block.false_block == dominator.self &&
		                         (block.true_block == dominator.merge_block ||
		                          (true_block && merge_block && execution_is_noop(*true_block, *merge_block)));

		if (block.merge == SPIRBlock::MergeNone && block.terminator == SPIRBlock::Select &&
		    (positive_do_while || negative_do_while))
		{
			return SPIRBlock::DoWhileLoop;
		}
		else
			return SPIRBlock::ComplexLoop;
	}
}